

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportEnumerator.cpp
# Opt level: O3

bool axl::spy::enumerateImports(ImportIterator *iterator,void *module)

{
  bool bVar1;
  ulong *puVar2;
  EVP_PKEY_CTX *dst;
  ElfRel *pEVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Ptr<axl::spy::ElfImportEnumeration> enumeration;
  Elf64_Dyn *dynTable [35];
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_1d8;
  ulong local_1c0;
  ulong local_1b8;
  long local_1b0;
  ImportIterator local_1a8;
  long local_148 [35];
  
  if (module == (void *)0x0) {
    module = _operator_delete;
  }
  memset(local_148,0,0x118);
  puVar2 = *(ulong **)((long)module + 0x10);
  uVar4 = *puVar2;
  if (uVar4 == 0) {
    local_148[0xb] = 0;
    lVar5 = 0;
    lVar6 = 0;
    lVar7 = 0;
  }
  else {
    do {
      if (uVar4 < 0x23) {
        local_148[uVar4] = (long)puVar2;
      }
      uVar4 = puVar2[2];
      puVar2 = puVar2 + 2;
      lVar5 = local_148[10];
      lVar6 = local_148[5];
      lVar7 = local_148[6];
    } while (uVar4 != 0);
  }
  if (((((lVar5 == 0 || lVar6 == 0) || (local_148[0xb] == 0 || lVar7 == 0)) ||
       ((local_148[7] == 0) == (local_148[8] != 0))) || ((local_148[9] == 0) != (local_148[7] == 0))
      ) || ((((local_148[0x17] == 0) == (local_148[2] != 0) ||
             (*(long *)(local_148[0xb] + 8) != 0x18)) ||
            ((local_148[9] != 0 && (*(long *)(local_148[9] + 8) != 0x18)))))) {
    err::Error::Error((Error *)&local_1a8,"invalid ELF (missing or bad section(s))");
    local_1d8.m_p = (ErrorHdr *)0x0;
    local_1d8.m_hdr = (BufHdr *)0x0;
    local_1d8.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move
              (&local_1d8,(BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)&local_1a8);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release
              ((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)&local_1a8);
    err::setError((ErrorRef *)&local_1d8);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_1d8);
    bVar1 = false;
  }
  else {
    if (local_148[2] == 0) {
      local_1b8 = 0;
    }
    else {
      local_1b8 = *(ulong *)(local_148[2] + 8) / 0x18;
    }
    if (local_148[8] == 0) {
      local_1c0 = 0;
    }
    else {
      local_1c0 = *(ulong *)(local_148[8] + 8) / 0x18;
    }
    if (local_1b8 == 0 && local_1c0 == 0) {
      local_1a8.super_ImportIteratorBase.m_symbolName.m_length._0_1_ = 0;
      local_1a8.super_ImportIteratorBase.m_symbolName._17_8_ = 0;
      local_1a8.super_ImportIteratorBase.m_symbolName.m_p = (C *)0x0;
      local_1a8.super_ImportIteratorBase.m_symbolName.m_hdr._0_1_ = 0;
      local_1a8.super_ImportIteratorBase.m_symbolName.m_hdr._1_7_ = 0;
      local_1a8.super_ImportIteratorBase.m_moduleName.m_p = (C *)0x0;
      local_1a8.super_ImportIteratorBase.m_moduleName.m_hdr._0_1_ = 0;
      local_1a8.super_ImportIteratorBase.m_moduleName.m_hdr._1_7_ = 0;
      local_1a8.super_ImportIteratorBase.m_moduleName.m_length._0_1_ = 0;
      local_1a8.super_ImportIteratorBase.m_moduleName._17_8_ = 0;
      local_1a8.super_ImportIteratorBase.m_slot = (void **)0x0;
      local_1a8.m_enumeration.m_p = (ElfImportEnumeration *)0x0;
      local_1a8.m_enumeration.m_refCount = (RefCount *)0x0;
      local_1a8.m_index = 0xffffffffffffffff;
      ImportIterator::operator=(iterator,&local_1a8);
      ImportIterator::~ImportIterator(&local_1a8);
    }
    else {
      local_1b0 = local_148[0x17];
      dst = (EVP_PKEY_CTX *)operator_new(0x58,(nothrow_t *)&std::nothrow);
      *(undefined4 *)(dst + 0x10) = 0;
      *(undefined4 *)(dst + 0x14) = 1;
      *(undefined ***)dst = &PTR__RefCount_0019df78;
      *(code **)(dst + 8) = mem::deallocate;
      local_1d8.m_p = (ErrorHdr *)0x0;
      local_1d8.m_hdr = (BufHdr *)0x0;
      rc::Ptr<axl::spy::ElfImportEnumeration>::copy
                ((Ptr<axl::spy::ElfImportEnumeration> *)&local_1d8,dst,dst);
      *(size_t *)((long)local_1d8.m_p + 0x18) = *module;
      *(Elf64_Sym **)((long)local_1d8.m_p + 0x20) = *(Elf64_Sym **)(lVar7 + 8);
      *(char **)((long)local_1d8.m_p + 0x28) = *(char **)(lVar6 + 8);
      *(size_t *)((long)local_1d8.m_p + 0x30) = *(size_t *)(lVar5 + 8);
      if (local_1b0 == 0) {
        pEVar3 = (ElfRel *)0x0;
      }
      else {
        pEVar3 = *(ElfRel **)(local_1b0 + 8);
      }
      *(ElfRel **)((long)local_1d8.m_p + 0x38) = pEVar3;
      *(ulong *)((long)local_1d8.m_p + 0x40) = local_1b8;
      if (local_148[7] == 0) {
        pEVar3 = (ElfRel *)0x0;
      }
      else {
        pEVar3 = *(ElfRel **)(local_148[7] + 8);
      }
      *(ElfRel **)((long)local_1d8.m_p + 0x48) = pEVar3;
      *(ulong *)((long)local_1d8.m_p + 0x50) = local_1c0;
      ImportIterator::ImportIterator(&local_1a8,(ElfImportEnumeration *)local_1d8.m_p);
      ImportIterator::operator=(iterator,&local_1a8);
      ImportIterator::~ImportIterator(&local_1a8);
      rc::Ptr<axl::spy::ElfImportEnumeration>::clear
                ((Ptr<axl::spy::ElfImportEnumeration> *)&local_1d8);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool
enumerateImports(
	ImportIterator* iterator,
	void* module
) {
	link_map* linkMap = module ? (link_map*)module : _r_debug.r_map;

	ElfW(Dyn)* dynTable[DT_NUM] = { 0 };
	ElfW(Dyn)* dyn = linkMap->l_ld;
	for (; dyn->d_tag; dyn++)
		if (dyn->d_tag < countof(dynTable))
			dynTable[dyn->d_tag] = dyn;

	// sanity check

	if (!dynTable[DT_SYMTAB] ||
		!dynTable[DT_SYMENT] ||
		!dynTable[DT_STRTAB] ||
		!dynTable[DT_STRSZ] ||
		!dynTable[DT_GOT_REL] != !dynTable[DT_GOT_RELSZ] ||
		!dynTable[DT_GOT_REL] != !dynTable[DT_GOT_RELENT] ||
		!dynTable[DT_JMPREL] != !dynTable[DT_PLTRELSZ] ||
		dynTable[DT_SYMENT]->d_un.d_val != sizeof(ElfW(Sym)) ||
		dynTable[DT_GOT_RELENT] && dynTable[DT_GOT_RELENT]->d_un.d_val != sizeof(ElfRel)) {
		err::setError("invalid ELF (missing or bad section(s))");
		return false;
	}

	size_t pltRelCount = dynTable[DT_PLTRELSZ] ? dynTable[DT_PLTRELSZ]->d_un.d_val / sizeof(ElfRel) : 0;
	size_t gotRelCount = dynTable[DT_GOT_RELSZ] ? dynTable[DT_GOT_RELSZ]->d_un.d_val / sizeof(ElfRel) : 0;

	if (!pltRelCount && !gotRelCount) {
		*iterator = ImportIterator();
		return true;
	}

	rc::Ptr<ElfImportEnumeration> enumeration = AXL_RC_NEW(ElfImportEnumeration);
	enumeration->m_baseAddress = linkMap->l_addr;
	enumeration->m_symbolTable = (ElfW(Sym)*)dynTable[DT_SYMTAB]->d_un.d_ptr;
	enumeration->m_stringTable = (char*)dynTable[DT_STRTAB]->d_un.d_ptr;
	enumeration->m_stringTableSize = dynTable[DT_STRSZ]->d_un.d_val;
	enumeration->m_pltRelTable = dynTable[DT_JMPREL] ? (ElfRel*)dynTable[DT_JMPREL]->d_un.d_ptr : NULL;
	enumeration->m_pltRelCount = pltRelCount;
	enumeration->m_gotRelTable = dynTable[DT_GOT_REL] ? (ElfRel*)dynTable[DT_GOT_REL]->d_un.d_ptr : NULL;
	enumeration->m_gotRelCount = gotRelCount;

	*iterator = ImportIterator(enumeration);
	return true;
}